

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bossac.cpp
# Opt level: O2

void __thiscall BossaConfig::BossaConfig(BossaConfig *this)

{
  this->_vptr_BossaConfig = (_func_int **)&PTR__BossaConfig_00117000;
  (this->portArg)._M_dataplus._M_p = (pointer)&(this->portArg).field_2;
  (this->portArg)._M_string_length = 0;
  (this->portArg).field_2._M_local_buf[0] = '\0';
  (this->lockArg)._M_dataplus._M_p = (pointer)&(this->lockArg).field_2;
  (this->lockArg)._M_string_length = 0;
  (this->lockArg).field_2._M_local_buf[0] = '\0';
  (this->unlockArg)._M_dataplus._M_p = (pointer)&(this->unlockArg).field_2;
  (this->unlockArg)._M_string_length = 0;
  (this->unlockArg).field_2._M_local_buf[0] = '\0';
  this->security = false;
  this->info = false;
  this->readArg = 0;
  this->offsetArg = 0;
  this->erase = false;
  this->write = false;
  this->read = false;
  this->verify = false;
  this->lock = false;
  this->port = false;
  this->boot = false;
  this->bor = false;
  this->bod = false;
  this->usbPort = false;
  this->arduinoErase = false;
  this->help = false;
  this->version = false;
  this->bootArg = 1;
  this->bodArg = 1;
  this->borArg = 1;
  this->usbPortArg = true;
  this->reset = false;
  return;
}

Assistant:

BossaConfig::BossaConfig()
{
    erase = false;
    write = false;
    read = false;
    verify = false;
    port = false;
    boot = false;
    bod = false;
    bor = false;
    lock = false;
    security = false;
    info = false;
    usbPort = false;
    arduinoErase = false;
    help = false;
    version = false;

    readArg = 0;
    offsetArg = 0;
    bootArg = 1;
    bodArg = 1;
    borArg = 1;
    usbPortArg=1;

    reset = false;
}